

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-fight-attack.c
# Opt level: O1

wchar_t borg_attack_aux_rest(void)

{
  ushort uVar1;
  int iVar2;
  borg_kill *pbVar3;
  _Bool _Var4;
  wchar_t wVar5;
  char *what;
  int iVar6;
  int iVar7;
  wchar_t wVar8;
  long lVar9;
  bool bVar10;
  long lVar11;
  
  wVar8 = L'\0';
  wVar5 = borg_danger(borg.c.y,borg.c.x,L'\x01',false,false);
  if (1 < borg_kills_nxt) {
    lVar9 = 1;
    lVar11 = 0x1d8;
    bVar10 = false;
    do {
      pbVar3 = borg_kills;
      uVar1 = *(ushort *)(borg_kills->spell + lVar11 + -0x19);
      if ((uVar1 != 0) && ((int)(uint)uVar1 < (int)(z_info->r_max - 1))) {
        iVar6 = *(int *)(borg_kills->spell + lVar11 + -0xd) - borg.c.x;
        iVar2 = -iVar6;
        if (0 < iVar6) {
          iVar2 = iVar6;
        }
        iVar7 = *(int *)(borg_kills->spell + lVar11 + -9) - borg.c.y;
        iVar6 = -iVar7;
        if (0 < iVar7) {
          iVar6 = iVar7;
        }
        if (iVar6 < iVar2) {
          iVar6 = iVar2;
        }
        if ((((((iVar6 == 2) && (borg_kills->spell[lVar11 + -1] == '\0')) &&
              (borg_kills->spell[lVar11 + -0x16] == '\x01')) &&
             (((int)borg_t - (int)*(short *)((long)&borg_kills->when + lVar11) < 0xb &&
              (_Var4 = flag_has_dbg(r_info[(uint)uVar1].flags,0xb,0x15,"r_info[kill->r_idx].flags",
                                    "RF_NEVER_MOVE"), !_Var4)))) &&
            (((int)((uint)pbVar3->spell[lVar11 + -3] - borg.trait[0x2c]) < 5 &&
             ((borg.goal.type == 1 &&
              (*(wchar_t *)(pbVar3->spell + lVar11 + -9) == (uint)borg_flow_y[0])))))) &&
           ((_Var4 = borg_los(borg.c.y,borg.c.x,*(wchar_t *)(pbVar3->spell + lVar11 + -9),
                              *(wchar_t *)(pbVar3->spell + lVar11 + -0xd)), _Var4 &&
            (wVar5 <= borg.trait[0x1b])))) {
          bVar10 = true;
        }
      }
      lVar9 = lVar9 + 1;
      lVar11 = lVar11 + 0x1d8;
    } while (lVar9 < borg_kills_nxt);
    wVar8 = L'\0';
    if ((bVar10) && (wVar8 = L'\x01', borg_simulate == false)) {
      borg_keypress(0x2c);
      what = format("# Resting on grid (%d, %d), waiting for monster to approach.",
                    (ulong)(uint)borg.c.y,(ulong)(uint)borg.c.x);
      borg_note(what);
    }
  }
  return wVar8;
}

Assistant:

static int borg_attack_aux_rest(void)
{
    int  i;
    bool resting_is_good = false;

    int my_danger        = borg_danger(borg.c.y, borg.c.x, 1, false, false);

    /* Examine all the monsters */
    for (i = 1; i < borg_kills_nxt; i++) {
        borg_kill *kill = &borg_kills[i];

        int x9          = kill->pos.x;
        int y9          = kill->pos.y;
        int ax, ay, d;

        /* Skip dead monsters */
        if (!kill->r_idx)
            continue;

        /* "player ghosts" */
        if (kill->r_idx >= z_info->r_max - 1)
            continue;

        /* Distance components */
        ax = (x9 > borg.c.x) ? (x9 - borg.c.x) : (borg.c.x - x9);
        ay = (y9 > borg.c.y) ? (y9 - borg.c.y) : (borg.c.y - y9);

        /* Distance */
        d = MAX(ax, ay);

        /* Minimal and maximal distance */
        if (d != 2)
            continue;

        /* Ranged Attacks, don't rest. */
        if (kill->ranged_attack)
            continue;

        /* Skip the sleeping ones */
        if (!kill->awake)
            continue;

        /* need to have seen it recently */
        if (borg_t - kill->when > 10)
            continue;

        /* Skip monsters that dont chase */
        if (rf_has(r_info[kill->r_idx].flags, RF_NEVER_MOVE))
            continue;

        /* Monster better not be faster than me */
        if (kill->speed - borg.trait[BI_SPEED] >= 5)
            continue;

        /* Should be flowing towards the monster */
        if (borg.goal.type != GOAL_KILL || borg_flow_y[0] != kill->pos.y)
            continue;

        /* Cant have an obstacle between us */
        if (!borg_los(borg.c.y, borg.c.x, kill->pos.y, kill->pos.x))
            continue;

        /* Might be a little dangerous to just wait here */
        if (my_danger > borg.trait[BI_CURHP])
            continue;

        /* Should be a good idea to wait for monster here. */
        resting_is_good = true;
    }

    /* Not a good idea */
    if (resting_is_good == false)
        return 0;

    /* Return some value for this rest */
    if (borg_simulate)
        return 1;

    /* Rest */
    borg_keypress(',');
    borg_note(
        format("# Resting on grid (%d, %d), waiting for monster to approach.",
            borg.c.y, borg.c.x));

    /* All done */
    return 1;
}